

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

parson_bool_t is_decimal(char *string,size_t length)

{
  int iVar1;
  char *pcVar2;
  ulong in_RSI;
  char *in_RDI;
  ulong local_18;
  
  if ((((in_RSI < 2) || (*in_RDI != '0')) || (in_RDI[1] == '.')) &&
     (((local_18 = in_RSI, in_RSI < 3 ||
       (iVar1 = strncmp(in_RDI,"-0",2), local_18 = in_RSI, iVar1 != 0)) ||
      (local_18 = in_RSI, in_RDI[2] == '.')))) {
    do {
      if (local_18 == 0) {
        return 1;
      }
      pcVar2 = strchr("xX",(int)in_RDI[local_18 - 1]);
      local_18 = local_18 - 1;
    } while (pcVar2 == (char *)0x0);
  }
  return 0;
}

Assistant:

static parson_bool_t is_decimal(const char *string, size_t length) {
    if (length > 1 && string[0] == '0' && string[1] != '.') {
        return PARSON_FALSE;
    }
    if (length > 2 && !strncmp(string, "-0", 2) && string[2] != '.') {
        return PARSON_FALSE;
    }
    while (length--) {
        if (strchr("xX", string[length])) {
            return PARSON_FALSE;
        }
    }
    return PARSON_TRUE;
}